

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean flush_bits_s(working_state *state)

{
  size_t *psVar1;
  JOCTET *pJVar2;
  jpeg_destination_mgr *pjVar3;
  boolean bVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = (state->cur).put_bits;
  if (0 < iVar5) {
    uVar6 = 0x7fL << (0x11U - (char)iVar5 & 0x3f) | (state->cur).put_buffer;
    iVar5 = iVar5 + 0xf;
    do {
      pJVar2 = state->next_output_byte;
      state->next_output_byte = pJVar2 + 1;
      *pJVar2 = (JOCTET)(uVar6 >> 0x10);
      psVar1 = &state->free_in_buffer;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        pjVar3 = state->cinfo->dest;
        bVar4 = (*pjVar3->empty_output_buffer)(state->cinfo);
        if (bVar4 == 0) {
          return 0;
        }
        state->next_output_byte = pjVar3->next_output_byte;
        state->free_in_buffer = pjVar3->free_in_buffer;
      }
      if ((~(uint)uVar6 & 0xff0000) == 0) {
        pJVar2 = state->next_output_byte;
        state->next_output_byte = pJVar2 + 1;
        *pJVar2 = '\0';
        psVar1 = &state->free_in_buffer;
        *psVar1 = *psVar1 - 1;
        if (*psVar1 == 0) {
          pjVar3 = state->cinfo->dest;
          bVar4 = (*pjVar3->empty_output_buffer)(state->cinfo);
          if (bVar4 == 0) {
            return 0;
          }
          state->next_output_byte = pjVar3->next_output_byte;
          state->free_in_buffer = pjVar3->free_in_buffer;
        }
      }
      uVar6 = uVar6 << 8;
      iVar5 = iVar5 + -8;
    } while (0xf < iVar5);
  }
  (state->cur).put_buffer = 0;
  (state->cur).put_bits = 0;
  return 1;
}

Assistant:

LOCAL(boolean)
flush_bits_s (working_state * state)
{
  if (! emit_bits_s(state, 0x7F, 7)) /* fill any partial byte with ones */
    return FALSE;
  state->cur.put_buffer = 0;	     /* and reset bit-buffer to empty */
  state->cur.put_bits = 0;
  return TRUE;
}